

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void prvTidyCleanWord2000(TidyDocImpl *doc,Node *node)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  Bool BVar5;
  int iVar6;
  Node *node_00;
  AttVal *pAVar7;
  AttVal *pAVar8;
  ctmbstr ptVar9;
  Dict *pDVar10;
  Node *pNVar11;
  bool bVar12;
  int local_a0;
  TidyTagId local_9c;
  Node *br;
  Dict *tag;
  TidyTagId listType;
  AttVal *atrStyle;
  AttVal *attr_1;
  Node *next_2;
  Node *next_1;
  AttVal *attr;
  Node *next;
  Node *pre;
  AttVal *attval;
  AttVal *next_attr;
  Node *list;
  Lexer *lexer;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  list = (Node *)doc->lexer;
  next_attr = (AttVal *)0x0;
  lexer = (Lexer *)node;
  node_local = &doc->root;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                if (lexer == (Lexer *)0x0) {
                  return;
                }
                if (((lexer != (Lexer *)0x0) && (*(long *)&lexer->state != 0)) &&
                   (**(int **)&lexer->state == 0x30)) {
                  BVar5 = prvTidyIsWord2000((TidyDocImpl *)node_local);
                  if (BVar5 == no) {
                    return;
                  }
                  pre = *(Node **)&lexer->versionEmitted;
                  while (pre != (Node *)0x0) {
                    attval = (AttVal *)pre->parent;
                    if ((pre->attributes == (AttVal *)0x0) ||
                       (iVar6 = strcmp((char *)pre->attributes,"xmlns"), iVar6 != 0)) {
                      prvTidyReportAttrError
                                ((TidyDocImpl *)node_local,(Node *)lexer,(AttVal *)pre,0x26f);
                    }
                    pre = (Node *)attval;
                  }
                  prvTidyFreeAttrs((TidyDocImpl *)node_local,(Node *)lexer);
                }
                if (((lexer != (Lexer *)0x0) && (*(long *)&lexer->state != 0)) &&
                   ((**(int **)&lexer->state == 0x50 &&
                    (BVar5 = NoMargins((Node *)lexer), BVar5 != no)))) {
                  prvTidyCoerceNode((TidyDocImpl *)node_local,(Node *)lexer,TidyTag_PRE,no,yes);
                  PurgeWord2000Attributes((TidyDocImpl *)node_local,(Node *)lexer);
                  lVar1._0_4_ = lexer->exiled;
                  lVar1._4_4_ = lexer->isvoyager;
                  if (lVar1 != 0) {
                    prvTidyCleanWord2000((TidyDocImpl *)node_local,*(Node **)&lexer->exiled);
                  }
                  next = (Node *)lexer;
                  lexer = *(Lexer **)&lexer->insertspace;
                  while( true ) {
                    bVar12 = false;
                    if (((lexer != (Lexer *)0x0) && (bVar12 = false, *(long *)&lexer->state != 0))
                       && (bVar12 = false, **(int **)&lexer->state == 0x50)) {
                      BVar5 = NoMargins((Node *)lexer);
                      bVar12 = BVar5 != no;
                    }
                    if (!bVar12) break;
                    attr = *(AttVal **)&lexer->insertspace;
                    prvTidyRemoveNode((Node *)lexer);
                    pNVar11 = next;
                    node_00 = prvTidyNewLineNode((Lexer *)list);
                    prvTidyInsertNodeAtEnd(pNVar11,node_00);
                    prvTidyInsertNodeAtEnd(next,(Node *)lexer);
                    StripSpan((TidyDocImpl *)node_local,(Node *)lexer);
                    lexer = (Lexer *)attr;
                  }
                  if (lexer == (Lexer *)0x0) {
                    return;
                  }
                }
                if (((*(long *)&lexer->state == 0) ||
                    ((*(uint *)(*(long *)&lexer->state + 0x20) & 8) == 0)) ||
                   (BVar5 = SingleSpace((Lexer *)list,(Node *)lexer), BVar5 == no)) break;
                lexer = (Lexer *)StripSpan((TidyDocImpl *)node_local,(Node *)lexer);
              }
              if ((((lexer == (Lexer *)0x0) || (*(long *)&lexer->state == 0)) ||
                  (**(int **)&lexer->state != 0x67)) &&
                 ((((lexer == (Lexer *)0x0 || (*(long *)&lexer->state == 0)) ||
                   (**(int **)&lexer->state != 0x44)) && (*(int *)&lexer->root != 2)))) break;
              lexer = (Lexer *)prvTidyDiscardElement((TidyDocImpl *)node_local,(Node *)lexer);
            }
            if ((((lexer == (Lexer *)0x0) || (*(long *)&lexer->state == 0)) ||
                (**(int **)&lexer->state != 100)) &&
               (((lexer == (Lexer *)0x0 || (*(long *)&lexer->state == 0)) ||
                (**(int **)&lexer->state != 0x24)))) break;
            lexer = (Lexer *)StripSpan((TidyDocImpl *)node_local,(Node *)lexer);
          }
          if ((((lexer == (Lexer *)0x0) || (*(long *)&lexer->state == 0)) ||
              (**(int **)&lexer->state != 0x3e)) ||
             (((next_1 = (Node *)prvTidyAttrGetById((Node *)lexer,TidyAttr_REL),
               next_1 == (Node *)0x0 || (next_1->was == (Dict *)0x0)) ||
              (iVar6 = prvTidytmbstrcasecmp((ctmbstr)next_1->was,"File-List"), iVar6 != 0)))) break;
          lexer = (Lexer *)prvTidyDiscardElement((TidyDocImpl *)node_local,(Node *)lexer);
        }
        if ((*(long *)&lexer->state == 0) ||
           (iVar6 = prvTidytmbstrcmp(*(ctmbstr *)(*(long *)&lexer->state + 8),"o:p"), iVar6 != 0))
        break;
        prvTidyReport((TidyDocImpl *)node_local,(Node *)0x0,(Node *)lexer,0x270);
        DiscardContainer((TidyDocImpl *)node_local,(Node *)lexer,&next_2);
        lexer = (Lexer *)next_2;
      }
      lVar2._0_4_ = lexer->exiled;
      lVar2._4_4_ = lexer->isvoyager;
      if ((lVar2 != 0) ||
         (((lexer == (Lexer *)0x0 || (*(long *)&lexer->state == 0)) ||
          (**(int **)&lexer->state != 0x50)))) break;
      lexer = (Lexer *)prvTidyTrimEmptyElement((TidyDocImpl *)node_local,(Node *)lexer);
    }
    if (((lexer == (Lexer *)0x0) || (*(long *)&lexer->state == 0)) ||
       (**(int **)&lexer->state != 0x50)) {
      next_attr = (AttVal *)0x0;
    }
    else {
      pAVar7 = prvTidyAttrGetById((Node *)lexer,TidyAttr_CLASS);
      pAVar8 = prvTidyAttrGetById((Node *)lexer,TidyAttr_STYLE);
      if (((((pAVar7 == (AttVal *)0x0) || (pAVar7->value == (tmbstr)0x0)) ||
           (iVar6 = prvTidytmbstrcasecmp(pAVar7->value,"MsoListBullet"), iVar6 != 0)) &&
          (((pAVar7 == (AttVal *)0x0 || (pAVar7->value == (tmbstr)0x0)) ||
           (iVar6 = prvTidytmbstrcasecmp(pAVar7->value,"MsoListNumber"), iVar6 != 0)))) &&
         (((pAVar8 == (AttVal *)0x0 || (pAVar8->value == (tmbstr)0x0)) ||
          (ptVar9 = prvTidytmbsubstr(pAVar8->value,"mso-list:"), ptVar9 == (ctmbstr)0x0)))) {
        if (((pAVar7 == (AttVal *)0x0) || (pAVar7->value == (tmbstr)0x0)) ||
           (iVar6 = prvTidytmbstrcasecmp(pAVar7->value,"Code"), iVar6 != 0)) {
          next_attr = (AttVal *)0x0;
          goto LAB_00161b4a;
        }
        pNVar11 = prvTidyNewLineNode((Lexer *)list);
        prvTidyNormalizeSpaces((Lexer *)list,*(Node **)&lexer->exiled);
        if (next_attr == (AttVal *)0x0) {
LAB_00161ad9:
          next_attr = (AttVal *)prvTidyInferredTag((TidyDocImpl *)node_local,TidyTag_PRE);
          prvTidyInsertNodeBeforeElement((Node *)lexer,(Node *)next_attr);
        }
        else {
          if ((next_attr == (AttVal *)0x0) || (next_attr[1].next == (AttVal *)0x0)) {
            local_a0 = 0;
          }
          else {
            local_a0 = *(int *)&(next_attr[1].next)->next;
          }
          if (local_a0 != 0x54) goto LAB_00161ad9;
        }
        prvTidyRemoveNode((Node *)lexer);
        prvTidyInsertNodeAtEnd((Node *)next_attr,(Node *)lexer);
        StripSpan((TidyDocImpl *)node_local,(Node *)lexer);
        prvTidyInsertNodeAtEnd((Node *)next_attr,pNVar11);
        lexer = (Lexer *)next_attr->asp;
      }
      else {
        tag._4_4_ = TidyTag_UL;
        if (((pAVar7 != (AttVal *)0x0) && (pAVar7->value != (tmbstr)0x0)) &&
           (iVar6 = prvTidytmbstrcasecmp(pAVar7->value,"MsoListNumber"), iVar6 == 0)) {
          tag._4_4_ = TidyTag_OL;
        }
        prvTidyCoerceNode((TidyDocImpl *)node_local,(Node *)lexer,TidyTag_LI,no,yes);
        if (next_attr == (AttVal *)0x0) {
LAB_001619cc:
          pDVar10 = prvTidyLookupTagDef(tag._4_4_);
          next_attr = (AttVal *)prvTidyInferredTag((TidyDocImpl *)node_local,pDVar10->id);
          prvTidyInsertNodeBeforeElement((Node *)lexer,(Node *)next_attr);
        }
        else {
          if ((next_attr == (AttVal *)0x0) || (next_attr[1].next == (AttVal *)0x0)) {
            local_9c = TidyTag_UNKNOWN;
          }
          else {
            local_9c = *(TidyTagId *)&(next_attr[1].next)->next;
          }
          if (local_9c != tag._4_4_) goto LAB_001619cc;
        }
        PurgeWord2000Attributes((TidyDocImpl *)node_local,(Node *)lexer);
        lVar3._0_4_ = lexer->exiled;
        lVar3._4_4_ = lexer->isvoyager;
        if (lVar3 != 0) {
          prvTidyCleanWord2000((TidyDocImpl *)node_local,*(Node **)&lexer->exiled);
        }
        prvTidyRemoveNode((Node *)lexer);
        prvTidyInsertNodeAtEnd((Node *)next_attr,(Node *)lexer);
        lexer = (Lexer *)next_attr;
      }
    }
LAB_00161b4a:
    if (lexer == (Lexer *)0x0) {
      return;
    }
    BVar5 = prvTidynodeIsElement((Node *)lexer);
    if (BVar5 != no) {
      PurgeWord2000Attributes((TidyDocImpl *)node_local,(Node *)lexer);
    }
    lVar4._0_4_ = lexer->exiled;
    lVar4._4_4_ = lexer->isvoyager;
    if (lVar4 != 0) {
      prvTidyCleanWord2000((TidyDocImpl *)node_local,*(Node **)&lexer->exiled);
    }
    lexer = *(Lexer **)&lexer->insertspace;
  } while( true );
}

Assistant:

void TY_(CleanWord2000)( TidyDocImpl* doc, Node *node)
{
    /* used to a list from a sequence of bulleted p's */
    Lexer* lexer = doc->lexer;
    Node* list = NULL;
    AttVal *next_attr, *attval;

    while ( node )
    {
        /* get rid of Word's xmlns attributes */
        if ( nodeIsHTML(node) )
        {
            /* check that it's a Word 2000 document */
            if ( !TY_(IsWord2000) (doc) ) /* Is. #896 */
                return;

            /* Output proprietary attributes to maintain errout compatibility
             * with traditional Tidy. This is a result of moving all of the
             * proprietary checks to near the end of the cleanup process,
             * meaning this result would not ordinarily be displayed. 
             */
            attval = node->attributes;
            while ( attval ) {
                next_attr = attval->next;

                /* Issue #591 - take care of a NULL attribute, too. */
                if ( !attval->attribute || ( strcmp(attval->attribute, "xmlns") != 0 ))
                    TY_(ReportAttrError)(doc, node, attval, PROPRIETARY_ATTRIBUTE);
                attval = next_attr;
            }

            TY_(FreeAttrs)( doc, node );
        }

        /* fix up preformatted sections by looking for a
        ** sequence of paragraphs with zero top/bottom margin
        */
        if ( nodeIsP(node) )
        {
            if (NoMargins(node))
            {
                Node *pre, *next;
                TY_(CoerceNode)(doc, node, TidyTag_PRE, no, yes);

                PurgeWord2000Attributes( doc, node );

                if (node->content)
                    TY_(CleanWord2000)( doc, node->content );

                pre = node;
                node = node->next;

                /* continue to strip p's */

                while ( nodeIsP(node) && NoMargins(node) )
                {
                    next = node->next;
                    TY_(RemoveNode)(node);
                    TY_(InsertNodeAtEnd)(pre, TY_(NewLineNode)(lexer));
                    TY_(InsertNodeAtEnd)(pre, node);
                    StripSpan( doc, node );
                    node = next;
                }

                if (node == NULL)
                    break;
            }
        }

        if (node->tag && (node->tag->model & CM_BLOCK)
            && SingleSpace(lexer, node))
        {
            node = StripSpan( doc, node );
            continue;
        }
        /* discard Word's style verbiage */
        if ( nodeIsSTYLE(node) || nodeIsMETA(node) ||
             node->type == CommentTag )
        {
            node = TY_(DiscardElement)( doc, node );
            continue;
        }

        /* strip out all span and font tags Word scatters so liberally! */
        if ( nodeIsSPAN(node) || nodeIsFONT(node) )
        {
            node = StripSpan( doc, node );
            continue;
        }

        if ( nodeIsLINK(node) )
        {
            AttVal *attr = TY_(AttrGetById)(node, TidyAttr_REL);

            if (AttrValueIs(attr, "File-List"))
            {
                node = TY_(DiscardElement)( doc, node );
                continue;
            }
        }

        /* discards <o:p> which encodes the paragraph mark */
        if ( node->tag && TY_(tmbstrcmp)(node->tag->name,"o:p")==0)
        {
            /* Output proprietary elements to maintain errout compatibility
             * with traditional Tidy. This is a result of moving all of the
             * proprietary checks to near the end of the cleanup process,
             * meaning this result would not ordinarily be displayed.
             */
            Node* next;
            TY_(Report)(doc, NULL, node, PROPRIETARY_ELEMENT);
            DiscardContainer( doc, node, &next );
            node = next;
            continue;
        }

        /* discard empty paragraphs */

        if ( node->content == NULL && nodeIsP(node) )
        {
            /*  Use the existing function to ensure consistency */
            Node *next = TY_(TrimEmptyElement)( doc, node );
            node = next;
            continue;
        }

        if ( nodeIsP(node) )
        {
            AttVal *attr, *atrStyle;
            
            attr = TY_(AttrGetById)(node, TidyAttr_CLASS);
            atrStyle = TY_(AttrGetById)(node, TidyAttr_STYLE);
            /*
               (JES) Sometimes Word marks a list item with the following hokie syntax
               <p class="MsoNormal" style="...;mso-list:l1 level1 lfo1;
                translate these into <li>
            */
            /* map sequence of <p class="MsoListBullet"> to <ul>...</ul> */
            /* map <p class="MsoListNumber"> to <ol>...</ol> */
            if ( AttrValueIs(attr, "MsoListBullet") ||
                 AttrValueIs(attr, "MsoListNumber") ||
                 AttrContains(atrStyle, "mso-list:") )
            {
                TidyTagId listType = TidyTag_UL;
                if (AttrValueIs(attr, "MsoListNumber"))
                    listType = TidyTag_OL;

                TY_(CoerceNode)(doc, node, TidyTag_LI, no, yes);

                if ( !list || TagId(list) != listType )
                {
                    const Dict* tag = TY_(LookupTagDef)( listType );
                    list = TY_(InferredTag)(doc, tag->id);
                    TY_(InsertNodeBeforeElement)(node, list);
                }

                PurgeWord2000Attributes( doc, node );

                if ( node->content )
                    TY_(CleanWord2000)( doc, node->content );

                /* remove node and append to contents of list */
                TY_(RemoveNode)(node);
                TY_(InsertNodeAtEnd)(list, node);
                node = list;
            }
            /* map sequence of <p class="Code"> to <pre>...</pre> */
            else if (AttrValueIs(attr, "Code"))
            {
                Node *br = TY_(NewLineNode)(lexer);
                TY_(NormalizeSpaces)(lexer, node->content);

                if ( !list || TagId(list) != TidyTag_PRE )
                {
                    list = TY_(InferredTag)(doc, TidyTag_PRE);
                    TY_(InsertNodeBeforeElement)(node, list);
                }

                /* remove node and append to contents of list */
                TY_(RemoveNode)(node);
                TY_(InsertNodeAtEnd)(list, node);
                StripSpan( doc, node );
                TY_(InsertNodeAtEnd)(list, br);
                node = list->next;
            }
            else
                list = NULL;
        }
        else
            list = NULL;

        if (!node)
            return;

        /* strip out style and class attributes */
        if (TY_(nodeIsElement)(node))
            PurgeWord2000Attributes( doc, node );

        if (node->content)
            TY_(CleanWord2000)( doc, node->content );

        node = node->next;
    }
}